

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::~small_vector
          (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *this)

{
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *in_RDI;
  pointer in_stack_ffffffffffffffe8;
  
  clear(in_RDI);
  if (in_RDI->m_dynamic_data != (pointer)0x0) {
    get_alloc(in_RDI);
    std::allocator_traits<std::allocator<float>_>::deallocate
              ((allocator_type *)in_RDI,in_stack_ffffffffffffffe8,0x17c8e3);
  }
  std::allocator<float>::~allocator((allocator<float> *)0x17c8f1);
  return;
}

Assistant:

~small_vector()
    {
        clear();

        if (m_dynamic_data)
        {
            atraits::deallocate(get_alloc(), m_dynamic_data, m_dynamic_capacity);
        }
    }